

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O0

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedColumnSizes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::ColSizeWriter>
          (NLW2_NLFeeder_C_Impl *this,ColSizeWriter *csw)

{
  NLW2_NLFeeder_C *pNVar1;
  NLW2_NLFeeder_C_Impl *in_RDI;
  function<void_(int)> f;
  anon_class_8_1_ba1d3d67 *__f;
  function<void_(int)> *in_stack_ffffffffffffffb0;
  _func_void_void_ptr_void_ptr *p_Var2;
  anon_class_8_1_ba1d3d67 local_30 [6];
  
  __f = local_30;
  std::function<void(int)>::
  function<mp::NLW2_NLFeeder_C_Impl::FeedColumnSizes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::ColSizeWriter>(mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::ColSizeWriter&)::_lambda(int)_1_,void>
            (in_stack_ffffffffffffffb0,__f);
  pNVar1 = NLF(in_RDI);
  p_Var2 = pNVar1->FeedColumnSizes;
  pNVar1 = NLF(in_RDI);
  (*p_Var2)(pNVar1->p_user_data_,__f);
  std::function<void_(int)>::~function((function<void_(int)> *)0x117a31);
  return;
}

Assistant:

void FeedColumnSizes(ColSizeWriter& csw) {
    assert(NLF().FeedColumnSizes);
    std::function<void(int )> f = [&csw](int cs) {
      csw.Write(cs);
    };
    NLF().FeedColumnSizes(NLF().p_user_data_, &f);
  }